

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.h
# Opt level: O0

RelationalExpr __thiscall
mp::
ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
::Convert(ExprConverter<mp::PreproProd<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>_>,_void>
          *this,LogicalCountExpr e,Kind kind)

{
  LogicalCountExpr *this_00;
  ExprBase lhs;
  ExprBase this_01;
  RelationalExpr RVar1;
  Kind in_EDX;
  long in_RDI;
  ExprBase in_stack_ffffffffffffffd0;
  
  this_00 = (LogicalCountExpr *)(in_RDI + 8);
  lhs.impl_ = (Impl *)LogicalCountExpr::lhs(this_00);
  this_01.impl_ = (Impl *)LogicalCountExpr::rhs(this_00);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01.impl_,
             (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
              )in_stack_ffffffffffffffd0.impl_,in_EDX);
  RVar1 = BasicExprFactory<std::allocator<char>_>::MakeRelational
                    ((BasicExprFactory<std::allocator<char>_> *)this_01.impl_,in_EDX,
                     (NumericExpr)lhs.impl_,(NumericExpr)in_stack_ffffffffffffffd0.impl_);
  return (BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>)
         RVar1.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_;
}

Assistant:

RelationalExpr Convert(LogicalCountExpr e, expr::Kind kind) {
    return factory_.MakeRelational(kind, e.lhs(), e.rhs());
  }